

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

void __thiscall wasm::Precompute::visitExpression(Precompute *this,Expression *curr)

{
  Name name;
  bool bVar1;
  Return *pRVar2;
  Break *pBVar3;
  Module *pMVar4;
  Expression *expression;
  PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_> *this_00;
  Expression *local_1e0;
  Expression *local_198;
  Builder local_120;
  Builder builder_1;
  Break *br;
  Builder builder;
  Return *ret;
  undefined1 local_60 [8];
  Flow flow;
  Expression *curr_local;
  Precompute *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  bVar1 = Properties::isConstantExpression(curr);
  if ((!bVar1) &&
     (bVar1 = Expression::is<wasm::Nop>((Expression *)flow.breakTo.super_IString.str._M_str), !bVar1
     )) {
    precomputeExpression
              ((Flow *)local_60,this,(Expression *)flow.breakTo.super_IString.str._M_str,true);
    bVar1 = canEmitConstantFor(this,(Literals *)local_60);
    if (bVar1) {
      bVar1 = Flow::breaking((Flow *)local_60);
      if (bVar1) {
        bVar1 = IString::operator==((IString *)
                                    ((long)&flow.values.super_SmallVector<wasm::Literal,_1UL>.
                                            flexible.
                                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                            ._M_impl.super__Vector_impl_data + 0x10),
                                    (IString *)&NONCONSTANT_FLOW);
        if (bVar1) {
          considerPartiallyPrecomputing(this,(Expression *)flow.breakTo.super_IString.str._M_str);
        }
        else {
          bVar1 = IString::operator==((IString *)
                                      ((long)&flow.values.super_SmallVector<wasm::Literal,_1UL>.
                                              flexible.
                                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                              ._M_impl.super__Vector_impl_data + 0x10),
                                      (IString *)RETURN_FLOW);
          if (bVar1) {
            pRVar2 = Expression::dynCast<wasm::Return>
                               ((Expression *)flow.breakTo.super_IString.str._M_str);
            if (pRVar2 == (Return *)0x0) {
              pMVar4 = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                       ::getModule(&(this->
                                    super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                                    ).
                                    super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                    .
                                    super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                  );
              Builder::Builder((Builder *)&br,pMVar4);
              bVar1 = Literals::isConcrete((Literals *)local_60);
              if (bVar1) {
                pMVar4 = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                         ::getModule(&(this->
                                      super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                                      ).
                                      super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                      .
                                      super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                    );
                local_198 = Flow::getConstExpression((Flow *)local_60,pMVar4);
              }
              else {
                local_198 = (Expression *)0x0;
              }
              pRVar2 = Builder::makeReturn((Builder *)&br,local_198);
              Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
              replaceCurrent(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                              ).
                              super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                              .
                              super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                             ,(Expression *)pRVar2);
            }
            else {
              Flow::Flow((Flow *)&builder,(Flow *)local_60);
              reuseConstantNode<wasm::Return>(this,pRVar2,(Flow *)&builder);
              Flow::~Flow((Flow *)&builder);
            }
          }
          else {
            pBVar3 = Expression::dynCast<wasm::Break>
                               ((Expression *)flow.breakTo.super_IString.str._M_str);
            if (pBVar3 == (Break *)0x0) {
              pMVar4 = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                       ::getModule(&(this->
                                    super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                                    ).
                                    super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                    .
                                    super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                  );
              Builder::Builder(&local_120,pMVar4);
              bVar1 = Literals::isConcrete((Literals *)local_60);
              if (bVar1) {
                pMVar4 = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                         ::getModule(&(this->
                                      super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                                      ).
                                      super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                      .
                                      super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                    );
                local_1e0 = Flow::getConstExpression((Flow *)local_60,pMVar4);
              }
              else {
                local_1e0 = (Expression *)0x0;
              }
              name.super_IString.str._M_str = (char *)flow.breakTo.super_IString.str._M_len;
              name.super_IString.str._M_len =
                   (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
              pBVar3 = Builder::makeBreak(&local_120,name,local_1e0,(Expression *)0x0);
              Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
              replaceCurrent(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                              ).
                              super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                              .
                              super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                             ,(Expression *)pBVar3);
            }
            else {
              wasm::Name::operator=
                        (&pBVar3->name,
                         (Name *)((long)&flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                         ._M_impl.super__Vector_impl_data + 0x10));
              pBVar3->condition = (Expression *)0x0;
              Flow::Flow((Flow *)&builder_1,(Flow *)local_60);
              reuseConstantNode<wasm::Break>(this,pBVar3,(Flow *)&builder_1);
              Flow::~Flow((Flow *)&builder_1);
            }
          }
        }
      }
      else {
        bVar1 = Literals::isConcrete((Literals *)local_60);
        if (bVar1) {
          this_00 = &(this->
                     super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                     ).
                     super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
          ;
          pMVar4 = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                   ::getModule(&this_00->
                                super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                              );
          expression = Flow::getConstExpression((Flow *)local_60,pMVar4);
          Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
          replaceCurrent(&this_00->
                          super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                         ,expression);
        }
        else {
          ExpressionManipulator::nop<wasm::Expression>
                    ((Expression *)flow.breakTo.super_IString.str._M_str);
        }
      }
    }
    Flow::~Flow((Flow *)local_60);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // TODO: if local.get, only replace with a constant if we don't care about
    // size...?
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }
    // try to evaluate this into a const
    Flow flow = precomputeExpression(curr);
    if (!canEmitConstantFor(flow.values)) {
      return;
    }
    if (flow.breaking()) {
      if (flow.breakTo == NONCONSTANT_FLOW) {
        // This cannot be turned into a constant, but perhaps we can partially
        // precompute it.
        considerPartiallyPrecomputing(curr);
        return;
      }
      if (flow.breakTo == RETURN_FLOW) {
        // this expression causes a return. if it's already a return, reuse the
        // node
        if (auto* ret = curr->dynCast<Return>()) {
          reuseConstantNode(ret, flow);
        } else {
          Builder builder(*getModule());
          replaceCurrent(builder.makeReturn(
            flow.values.isConcrete() ? flow.getConstExpression(*getModule())
                                     : nullptr));
        }
        return;
      }
      // this expression causes a break, emit it directly. if it's already a br,
      // reuse the node.
      if (auto* br = curr->dynCast<Break>()) {
        br->name = flow.breakTo;
        br->condition = nullptr;
        reuseConstantNode(br, flow);
      } else {
        Builder builder(*getModule());
        replaceCurrent(builder.makeBreak(
          flow.breakTo,
          flow.values.isConcrete() ? flow.getConstExpression(*getModule())
                                   : nullptr));
      }
      return;
    }
    // this was precomputed
    if (flow.values.isConcrete()) {
      replaceCurrent(flow.getConstExpression(*getModule()));
    } else {
      ExpressionManipulator::nop(curr);
    }
  }